

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O1

void csp_memfree(uint16_t node,uint32_t timeout)

{
  int iVar1;
  uint32_t memfree;
  uint local_c;
  
  iVar1 = csp_get_memfree(node,timeout,&local_c);
  if (iVar1 == 0) {
    csp_print_func("Free Memory at node %u is %u bytes\r\n",(ulong)node,(ulong)local_c);
  }
  else {
    csp_print_func("Network error\r\n");
  }
  return;
}

Assistant:

void csp_memfree(uint16_t node, uint32_t timeout) {

	uint32_t memfree;
	int err = csp_get_memfree(node, timeout, &memfree);
	if (err == CSP_ERR_NONE) {
		csp_print("Free Memory at node %u is %" PRIu32 " bytes\r\n", node, memfree);
	} else {
		csp_print("Network error\r\n");
	}
}